

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  char *__format;
  timeval tVar6;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1dc;
  long local_1d8;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    test_cold_13();
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar2,0x2a,1);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar2,0x40,0);
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar2,0x51,0);
          if (iVar1 == 0) {
            lVar3 = curl_multi_init();
            if (lVar3 != 0) {
              iVar1 = curl_multi_add_handle(lVar3,lVar2);
              if (iVar1 == 0) {
                iVar1 = curl_multi_perform(lVar3,&local_1dc);
                if (iVar1 == 0) {
                  if (local_1dc < 0) {
                    fprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                            ,0x45);
                    iVar1 = 0x7a;
                  }
                  else {
                    tVar6 = tutil_tvnow();
                    lVar4 = tutil_tvdiff(tVar6,tv_test_start);
                    if (lVar4 < 0xea61) {
                      iVar1 = 0;
                      if (local_1dc != 0) {
                        local_1d8 = lVar2;
                        do {
                          local_1cc = -99;
                          local_b8.__fds_bits[0] = 0;
                          local_b8.__fds_bits[1] = 0;
                          local_b8.__fds_bits[2] = 0;
                          local_b8.__fds_bits[3] = 0;
                          local_b8.__fds_bits[4] = 0;
                          local_b8.__fds_bits[5] = 0;
                          local_b8.__fds_bits[6] = 0;
                          local_b8.__fds_bits[7] = 0;
                          local_b8.__fds_bits[8] = 0;
                          local_b8.__fds_bits[9] = 0;
                          local_b8.__fds_bits[10] = 0;
                          local_b8.__fds_bits[0xb] = 0;
                          local_b8.__fds_bits[0xc] = 0;
                          local_b8.__fds_bits[0xd] = 0;
                          local_b8.__fds_bits[0xe] = 0;
                          local_b8.__fds_bits[0xf] = 0;
                          local_138.__fds_bits[0] = 0;
                          local_138.__fds_bits[1] = 0;
                          local_138.__fds_bits[2] = 0;
                          local_138.__fds_bits[3] = 0;
                          local_138.__fds_bits[4] = 0;
                          local_138.__fds_bits[5] = 0;
                          local_138.__fds_bits[6] = 0;
                          local_138.__fds_bits[7] = 0;
                          local_138.__fds_bits[8] = 0;
                          local_138.__fds_bits[9] = 0;
                          local_138.__fds_bits[10] = 0;
                          local_138.__fds_bits[0xb] = 0;
                          local_138.__fds_bits[0xc] = 0;
                          local_138.__fds_bits[0xd] = 0;
                          local_138.__fds_bits[0xe] = 0;
                          local_138.__fds_bits[0xf] = 0;
                          local_1b8.__fds_bits[0xe] = 0;
                          local_1b8.__fds_bits[0xf] = 0;
                          local_1b8.__fds_bits[0xc] = 0;
                          local_1b8.__fds_bits[0xd] = 0;
                          local_1b8.__fds_bits[10] = 0;
                          local_1b8.__fds_bits[0xb] = 0;
                          local_1b8.__fds_bits[8] = 0;
                          local_1b8.__fds_bits[9] = 0;
                          local_1b8.__fds_bits[6] = 0;
                          local_1b8.__fds_bits[7] = 0;
                          local_1b8.__fds_bits[4] = 0;
                          local_1b8.__fds_bits[5] = 0;
                          local_1b8.__fds_bits[2] = 0;
                          local_1b8.__fds_bits[3] = 0;
                          local_1b8.__fds_bits[0] = 0;
                          local_1b8.__fds_bits[1] = 0;
                          local_1c8.tv_sec = 1;
                          local_1c8.tv_usec = 0;
                          iVar1 = curl_multi_fdset(lVar3,&local_b8,&local_138,&local_1b8,&local_1cc)
                          ;
                          if (iVar1 != 0) {
                            test_cold_8();
                            lVar2 = local_1d8;
                            goto LAB_0010294a;
                          }
                          if (local_1cc < -1) {
                            __format = 
                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                            ;
                            uVar5 = 0x5a;
LAB_0010290e:
                            fprintf(_stderr,__format,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                    ,uVar5);
                            iVar1 = 0x7a;
                            lVar2 = local_1d8;
                            goto LAB_0010294a;
                          }
                          iVar1 = select_wrapper(local_1cc + 1,&local_b8,&local_138,&local_1b8,
                                                 &local_1c8);
                          if (iVar1 == -1) {
                            test_cold_11();
                            iVar1 = 0x79;
                            lVar2 = local_1d8;
                            goto LAB_0010294a;
                          }
                          tVar6 = tutil_tvnow();
                          lVar2 = tutil_tvdiff(tVar6,tv_test_start);
                          if (60000 < lVar2) {
                            test_cold_9();
LAB_00102940:
                            iVar1 = 0x7d;
                            lVar2 = local_1d8;
                            goto LAB_0010294a;
                          }
                          iVar1 = curl_multi_perform(lVar3,&local_1dc);
                          if (iVar1 != 0) {
                            test_cold_10();
                            lVar2 = local_1d8;
                            goto LAB_0010294a;
                          }
                          if (local_1dc < 0) {
                            __format = 
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ;
                            uVar5 = 99;
                            goto LAB_0010290e;
                          }
                          tVar6 = tutil_tvnow();
                          lVar2 = tutil_tvdiff(tVar6,tv_test_start);
                          if (60000 < lVar2) {
                            fprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                    ,0x65);
                            goto LAB_00102940;
                          }
                        } while (local_1dc != 0);
                        iVar1 = 0;
                        lVar2 = local_1d8;
                      }
                    }
                    else {
                      test_cold_7();
                      iVar1 = 0x7d;
                    }
                  }
                }
                else {
                  test_cold_6();
                }
              }
              else {
                test_cold_5();
              }
              goto LAB_0010294a;
            }
            test_cold_12();
            iVar1 = 0x7b;
          }
          else {
            test_cold_4();
          }
        }
        else {
          test_cold_3();
        }
      }
      else {
        test_cold_2();
      }
    }
    else {
      test_cold_1();
    }
  }
  lVar3 = 0;
LAB_0010294a:
  curl_multi_cleanup(lVar3);
  curl_easy_cleanup(lVar2);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}